

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O2

int fe_check_prespeech(fe_t *fe,int32 *inout_nframes,mfcc_t **buf_cep,int outidx,int32 *out_frameidx
                      ,size_t *inout_nsamps,int orig_nsamps)

{
  int32 iVar1;
  
  if (fe->vad_data->in_speech != '\0') {
    iVar1 = fe_prespch_ncep(fe->vad_data->prespch_buf);
    if (iVar1 < 1) {
      outidx = outidx + 1;
      *inout_nframes = *inout_nframes + -1;
    }
    else {
      outidx = fe_copy_from_prespch(fe,inout_nframes,buf_cep,outidx);
      if (out_frameidx != (int32 *)0x0) {
        *out_frameidx =
             (int)((((long)orig_nsamps + fe->num_processed_samps) - *inout_nsamps) /
                  (ulong)(long)fe->frame_shift) - (int)fe->pre_speech;
      }
    }
  }
  if (0 < fe->num_overflow_samps) {
    fe->num_overflow_samps = fe->num_overflow_samps - fe->frame_shift;
  }
  return outidx;
}

Assistant:

static int
fe_check_prespeech(fe_t *fe, int32 *inout_nframes, mfcc_t **buf_cep, int outidx, int32 *out_frameidx, size_t *inout_nsamps, int orig_nsamps)
{
    if (fe->vad_data->in_speech) {    
	if (fe_prespch_ncep(fe->vad_data->prespch_buf) > 0) {

    	    /* Previous frame triggered vad into speech state. Last frame is in the end of 
    	       prespeech buffer, so overwrite it */
    	    outidx = fe_copy_from_prespch(fe, inout_nframes, buf_cep, outidx);

            /* Sets the start frame for the returned data so that caller can update timings */
	    if (out_frameidx) {
    	        *out_frameidx = (fe->num_processed_samps + orig_nsamps - *inout_nsamps) / fe->frame_shift - fe->pre_speech;
    	    }
    	} else {
	    outidx++;
    	    (*inout_nframes)--;
    	}
    }
    /* Amount of data behind the original input which is still needed. */
    if (fe->num_overflow_samps > 0)
        fe->num_overflow_samps -= fe->frame_shift;

    return outidx;
}